

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O3

void __thiscall QWidgetWindow::setNativeWindowVisibility(QWidgetWindow *this,bool visible)

{
  undefined8 uVar1;
  QDebug QVar2;
  QLoggingCategory *pQVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined8 *)&this->field_0x8;
  pQVar3 = QtPrivateLogging::lcWidgetShowHide();
  if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::debug();
    QVar2.stream = local_60.stream;
    QVar5.m_data = (storage_type *)0x15;
    QVar5.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60.stream,' ');
    }
    *(int *)((QTextStream *)local_60.stream + 0x28) =
         *(int *)((QTextStream *)local_60.stream + 0x28) + 1;
    ::operator<<((Stream *)&local_50,(QWindow *)&local_58);
    QVar2.stream = local_50.stream;
    QVar6.m_data = (storage_type *)0x2;
    QVar6.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    pcVar4 = "false";
    if (visible) {
      pcVar4 = "true";
    }
    QTextStream::operator<<((QTextStream *)local_50.stream,pcVar4);
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    QVar2.stream = local_50.stream;
    QVar7.m_data = (storage_type *)0x2c;
    QVar7.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug(&local_60);
  }
  QWindowPrivate::setVisible(SUB81(uVar1,0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::setNativeWindowVisibility(bool visible)
{
    Q_D(QWidgetWindow);
    qCDebug(lcWidgetShowHide) << "Setting visibility of" << this
        << "to" << visible << "via QWidgetWindow::setNativeWindowVisibility";

    // Call base class setVisible() implementation to run the QWindow
    // visibility logic. Don't call QWidgetWindowPrivate::setVisible()
    // since that will recurse back into QWidget code.
    d->QWindowPrivate::setVisible(visible);
}